

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  int *ip_00;
  seqDef *psVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  BYTE *pStart;
  BYTE *pBVar6;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  ulong *puVar10;
  int *piVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  U32 UVar16;
  size_t sVar17;
  ulong *puVar18;
  BYTE *ip;
  BYTE *pBVar19;
  BYTE *pBVar20;
  size_t offsetFound;
  BYTE *pInLoopLimit;
  uint local_a0;
  uint local_9c;
  size_t local_98;
  ulong *local_90;
  int *local_88;
  ulong *local_80;
  ulong *local_78;
  long local_70;
  ZSTD_matchState_t *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  seqStore_t *local_50;
  uint *local_48;
  BYTE *local_40;
  ulong *local_38;
  
  local_90 = (ulong *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 8));
  local_40 = (ms->window).base + (ms->window).dictLimit;
  local_54 = rep[1];
  piVar11 = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  local_58 = (int)piVar11 - (int)local_40;
  local_9c = local_54;
  if (local_58 < local_54) {
    local_9c = 0;
  }
  local_5c = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_a0 = local_5c;
  if (local_58 < local_5c) {
    local_a0 = 0;
  }
  local_48 = rep;
  if (piVar11 < local_88) {
    puVar18 = (ulong *)((long)local_90 + -7);
    local_78 = (ulong *)((long)local_90 + -3);
    local_80 = (ulong *)((long)local_90 + -1);
    local_68 = ms;
    local_50 = seqStore;
    local_38 = puVar18;
    do {
      local_70 = -(ulong)local_a0;
      if (local_a0 == 0) {
        pBVar20 = (BYTE *)0x0;
      }
      else {
        pBVar20 = (BYTE *)0x0;
        if (*(int *)(((long)piVar11 + 1) - (ulong)local_a0) == *(int *)((long)piVar11 + 1)) {
          puVar1 = (ulong *)((long)piVar11 + 5);
          puVar10 = (ulong *)((long)piVar11 + local_70 + 5);
          puVar12 = puVar1;
          if (puVar1 < puVar18) {
            uVar13 = *puVar1 ^ *puVar10;
            uVar8 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            pBVar20 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
            if (*puVar10 == *puVar1) {
              puVar12 = (ulong *)((long)piVar11 + 0xd);
              puVar10 = (ulong *)((long)piVar11 + local_70 + 0xd);
              do {
                if (puVar18 <= puVar12) goto LAB_004344a3;
                uVar8 = *puVar10;
                uVar13 = *puVar12;
                uVar15 = uVar13 ^ uVar8;
                uVar14 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                pBVar20 = (BYTE *)((long)puVar12 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar1));
                puVar12 = puVar12 + 1;
                puVar10 = puVar10 + 1;
              } while (uVar8 == uVar13);
            }
          }
          else {
LAB_004344a3:
            if ((puVar12 < local_78) && ((int)*puVar10 == (int)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 4);
              puVar10 = (ulong *)((long)puVar10 + 4);
            }
            if ((puVar12 < local_80) && ((short)*puVar10 == (short)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 2);
              puVar10 = (ulong *)((long)puVar10 + 2);
            }
            if (puVar12 < local_90) {
              puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar12));
            }
            pBVar20 = (BYTE *)((long)puVar12 - (long)puVar1);
          }
          pBVar20 = pBVar20 + 4;
        }
      }
      local_98 = 999999999;
      pBVar6 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                 (local_68,(BYTE *)piVar11,(BYTE *)local_90,&local_98);
      pBVar19 = pBVar20;
      if (pBVar20 < pBVar6) {
        pBVar19 = pBVar6;
      }
      if (pBVar19 < (BYTE *)0x4) {
        piVar11 = (int *)((long)piVar11 + ((long)piVar11 - (long)src >> 8) + 1);
      }
      else {
        piVar7 = piVar11;
        sVar17 = local_98;
        if (pBVar6 <= pBVar20) {
          piVar7 = (int *)((long)piVar11 + 1);
          sVar17 = 0;
        }
        if (piVar11 < local_88) {
          do {
            ip_00 = (int *)((long)piVar11 + 1);
            if (((sVar17 != 0) && (local_a0 != 0)) && (*ip_00 == *(int *)((long)ip_00 + local_70)))
            {
              puVar1 = (ulong *)((long)piVar11 + 5);
              puVar10 = (ulong *)((long)piVar11 + local_70 + 5);
              puVar12 = puVar1;
              if (puVar1 < puVar18) {
                uVar13 = *puVar1 ^ *puVar10;
                uVar8 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                pBVar20 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
                if (*puVar10 == *puVar1) {
                  puVar12 = (ulong *)((long)piVar11 + 0xd);
                  puVar10 = (ulong *)((long)piVar11 + local_70 + 0xd);
                  do {
                    if (puVar18 <= puVar12) goto LAB_004345f7;
                    uVar8 = *puVar10;
                    uVar13 = *puVar12;
                    uVar15 = uVar13 ^ uVar8;
                    uVar14 = 0;
                    if (uVar15 != 0) {
                      for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    pBVar20 = (BYTE *)((long)puVar12 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar1));
                    puVar12 = puVar12 + 1;
                    puVar10 = puVar10 + 1;
                  } while (uVar8 == uVar13);
                }
              }
              else {
LAB_004345f7:
                if ((puVar12 < local_78) && ((int)*puVar10 == (int)*puVar12)) {
                  puVar12 = (ulong *)((long)puVar12 + 4);
                  puVar10 = (ulong *)((long)puVar10 + 4);
                }
                if ((puVar12 < local_80) && ((short)*puVar10 == (short)*puVar12)) {
                  puVar12 = (ulong *)((long)puVar12 + 2);
                  puVar10 = (ulong *)((long)puVar10 + 2);
                }
                if (puVar12 < local_90) {
                  puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar12));
                }
                pBVar20 = (BYTE *)((long)puVar12 - (long)puVar1);
              }
              if (pBVar20 < (BYTE *)0xfffffffffffffffc) {
                uVar5 = (int)sVar17 + 1;
                uVar9 = 0x1f;
                if (uVar5 != 0) {
                  for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                  }
                }
                if ((int)((uVar9 ^ 0x1f) + (int)pBVar19 * 3 + -0x1e) < (int)(pBVar20 + 4) * 3) {
                  sVar17 = 0;
                  piVar7 = ip_00;
                  pBVar19 = pBVar20 + 4;
                }
              }
            }
            local_98 = 999999999;
            pBVar20 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                        (local_68,(BYTE *)ip_00,(BYTE *)local_90,&local_98);
            puVar18 = local_38;
            bVar4 = true;
            if ((BYTE *)0x3 < pBVar20) {
              uVar5 = (int)sVar17 + 1;
              uVar9 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar5 = (int)local_98 + 1;
              iVar3 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)((uVar9 ^ 0x1f) + (int)pBVar19 * 4 + -0x1b) < (int)pBVar20 * 4 - iVar3) {
                bVar4 = false;
                piVar7 = ip_00;
                sVar17 = local_98;
                pBVar19 = pBVar20;
              }
            }
            if (bVar4) {
              if (local_88 <= ip_00) break;
              ip_00 = (int *)((long)piVar11 + 2);
              if (((sVar17 != 0) && (local_a0 != 0)) && (*ip_00 == *(int *)((long)ip_00 + local_70))
                 ) {
                puVar1 = (ulong *)((long)piVar11 + 6);
                puVar10 = (ulong *)((long)piVar11 + local_70 + 6);
                puVar12 = puVar1;
                if (puVar1 < local_38) {
                  uVar13 = *puVar1 ^ *puVar10;
                  uVar8 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                    }
                  }
                  pBVar20 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
                  if (*puVar10 == *puVar1) {
                    puVar12 = (ulong *)((long)piVar11 + 0xe);
                    puVar10 = (ulong *)((long)piVar11 + local_70 + 0xe);
                    do {
                      if (local_38 <= puVar12) goto LAB_00434783;
                      uVar8 = *puVar10;
                      uVar13 = *puVar12;
                      uVar15 = uVar13 ^ uVar8;
                      uVar14 = 0;
                      if (uVar15 != 0) {
                        for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                        }
                      }
                      pBVar20 = (BYTE *)((long)puVar12 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar1)
                                        );
                      puVar12 = puVar12 + 1;
                      puVar10 = puVar10 + 1;
                    } while (uVar8 == uVar13);
                  }
                }
                else {
LAB_00434783:
                  if ((puVar12 < local_78) && ((int)*puVar10 == (int)*puVar12)) {
                    puVar12 = (ulong *)((long)puVar12 + 4);
                    puVar10 = (ulong *)((long)puVar10 + 4);
                  }
                  if ((puVar12 < local_80) && ((short)*puVar10 == (short)*puVar12)) {
                    puVar12 = (ulong *)((long)puVar12 + 2);
                    puVar10 = (ulong *)((long)puVar10 + 2);
                  }
                  if (puVar12 < local_90) {
                    puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar12));
                  }
                  pBVar20 = (BYTE *)((long)puVar12 - (long)puVar1);
                }
                if (pBVar20 < (BYTE *)0xfffffffffffffffc) {
                  uVar5 = (int)sVar17 + 1;
                  uVar9 = 0x1f;
                  if (uVar5 != 0) {
                    for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                    }
                  }
                  if ((int)((uVar9 ^ 0x1f) + (int)pBVar19 * 4 + -0x1e) < (int)(pBVar20 + 4) * 4) {
                    sVar17 = 0;
                    piVar7 = ip_00;
                    pBVar19 = pBVar20 + 4;
                  }
                }
              }
              local_98 = 999999999;
              pBVar20 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                          (local_68,(BYTE *)ip_00,(BYTE *)local_90,&local_98);
              bVar4 = true;
              if ((BYTE *)0x3 < pBVar20) {
                uVar5 = (int)sVar17 + 1;
                uVar9 = 0x1f;
                if (uVar5 != 0) {
                  for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                  }
                }
                uVar5 = (int)local_98 + 1;
                iVar3 = 0x1f;
                if (uVar5 != 0) {
                  for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                  }
                }
                if ((int)((uVar9 ^ 0x1f) + (int)pBVar19 * 4 + -0x18) < (int)pBVar20 * 4 - iVar3) {
                  bVar4 = false;
                  piVar7 = ip_00;
                  sVar17 = local_98;
                  pBVar19 = pBVar20;
                }
              }
              if (bVar4) break;
            }
            piVar11 = ip_00;
          } while (piVar11 < local_88);
        }
        if (sVar17 == 0) {
          UVar16 = 1;
        }
        else {
          if ((src < piVar7) && (local_40 < (BYTE *)((long)piVar7 + (2 - sVar17)))) {
            piVar11 = piVar7;
            while (piVar7 = piVar11,
                  *(BYTE *)((long)piVar11 + -1) == *(BYTE *)((long)piVar11 + (1 - sVar17))) {
              piVar7 = (int *)((long)piVar11 + -1);
              pBVar19 = pBVar19 + 1;
              if ((piVar7 <= src) ||
                 (pBVar20 = (BYTE *)((long)piVar11 + (1 - sVar17)), piVar11 = piVar7,
                 pBVar20 <= local_40)) break;
            }
          }
          UVar16 = (int)sVar17 + 1;
          local_9c = local_a0;
          local_a0 = (int)sVar17 - 2;
        }
        uVar8 = (long)piVar7 - (long)src;
        pBVar6 = local_50->lit;
        pBVar20 = pBVar6 + uVar8;
        do {
          *(undefined8 *)pBVar6 = *src;
          pBVar6 = pBVar6 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar6 < pBVar20);
        local_50->lit = local_50->lit + uVar8;
        if (0xffff < uVar8) {
          local_50->longLengthID = 1;
          local_50->longLengthPos =
               (U32)((ulong)((long)local_50->sequences - (long)local_50->sequencesStart) >> 3);
        }
        psVar2 = local_50->sequences;
        psVar2->litLength = (U16)uVar8;
        psVar2->offset = UVar16;
        if ((BYTE *)0xffff < pBVar19 + -3) {
          local_50->longLengthID = 2;
          local_50->longLengthPos =
               (U32)((ulong)((long)psVar2 - (long)local_50->sequencesStart) >> 3);
        }
        psVar2->matchLength = (U16)(pBVar19 + -3);
        local_50->sequences = psVar2 + 1;
        piVar11 = (int *)((long)piVar7 + (long)pBVar19);
        src = piVar11;
        if ((local_9c != 0) && (uVar9 = local_9c, piVar11 <= local_88)) {
          while (uVar5 = local_a0, uVar8 = (ulong)uVar9, src = piVar11, local_a0 = uVar5,
                local_9c = uVar9, *piVar11 == *(int *)((long)piVar11 - uVar8)) {
            puVar1 = (ulong *)(piVar11 + 1);
            puVar10 = (ulong *)((long)piVar11 + (4 - uVar8));
            puVar12 = puVar1;
            if (puVar1 < puVar18) {
              uVar14 = *puVar1 ^ *puVar10;
              uVar13 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              pBVar20 = (BYTE *)(uVar13 >> 3 & 0x1fffffff);
              if (*puVar10 == *puVar1) {
                puVar12 = (ulong *)(piVar11 + 3);
                puVar10 = (ulong *)((long)piVar11 + (0xc - uVar8));
                do {
                  if (puVar18 <= puVar12) goto LAB_00434a0f;
                  uVar8 = *puVar10;
                  uVar13 = *puVar12;
                  uVar15 = uVar13 ^ uVar8;
                  uVar14 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                    }
                  }
                  pBVar20 = (BYTE *)((long)puVar12 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar1));
                  puVar12 = puVar12 + 1;
                  puVar10 = puVar10 + 1;
                } while (uVar8 == uVar13);
              }
            }
            else {
LAB_00434a0f:
              if ((puVar12 < local_78) && ((int)*puVar10 == (int)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 4);
                puVar10 = (ulong *)((long)puVar10 + 4);
              }
              if ((puVar12 < local_80) && ((short)*puVar10 == (short)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 2);
                puVar10 = (ulong *)((long)puVar10 + 2);
              }
              if (puVar12 < local_90) {
                puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar12));
              }
              pBVar20 = (BYTE *)((long)puVar12 - (long)puVar1);
            }
            *(undefined8 *)local_50->lit = *(undefined8 *)piVar11;
            psVar2 = local_50->sequences;
            psVar2->litLength = 0;
            psVar2->offset = 1;
            if ((BYTE *)0xffff < pBVar20 + 1) {
              local_50->longLengthID = 2;
              local_50->longLengthPos =
                   (U32)((ulong)((long)psVar2 - (long)local_50->sequencesStart) >> 3);
            }
            psVar2->matchLength = (U16)(pBVar20 + 1);
            local_50->sequences = psVar2 + 1;
            piVar11 = (int *)((long)piVar11 + (long)(pBVar20 + 4));
            src = piVar11;
            local_a0 = uVar9;
            local_9c = uVar5;
            if ((uVar5 == 0) || (uVar9 = uVar5, local_88 < piVar11)) break;
          }
        }
      }
    } while (piVar11 < local_88);
  }
  uVar9 = 0;
  if (local_58 < local_54) {
    uVar9 = local_54;
  }
  if (local_58 < local_5c) {
    uVar9 = local_5c;
  }
  if (local_a0 == 0) {
    local_a0 = uVar9;
  }
  if (local_9c != 0) {
    uVar9 = local_9c;
  }
  *local_48 = local_a0;
  local_48[1] = uVar9;
  return (long)local_90 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 1, 2, ZSTD_noDict);
}